

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O0

bool slang::ast::SpecifyBlockSymbol::checkPathTerminal
               (ValueSymbol *terminal,Type *type,Scope *specifyParent,SpecifyTerminalDir dir,
               SourceRange sourceRange)

{
  ArgumentDirection AVar1;
  string_view arg;
  bool bVar2;
  ModportPortSymbol *pMVar3;
  Scope *this;
  Symbol *pSVar4;
  InstanceBodySymbol *this_00;
  DefinitionSymbol *pDVar5;
  Symbol *pSVar6;
  PortSymbol *pPVar7;
  int in_ECX;
  Scope *in_RDX;
  ValueSymbol *in_RDI;
  ArgumentDirection portDir_1;
  PortBackref *portRef;
  Symbol *terminalParent;
  Scope *terminalParentScope;
  ArgumentDirection portDir;
  anon_class_32_4_2c8b6779 reportErr;
  Scope *in_stack_00000078;
  SourceRange in_stack_00000080;
  Type *in_stack_ffffffffffffff40;
  PortBackref *local_b0;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  Type *in_stack_ffffffffffffff88;
  Diagnostic *in_stack_ffffffffffffff90;
  Scope *this_01;
  bool local_1;
  
  bVar2 = Type::isIntegral(in_stack_ffffffffffffff40);
  if (bVar2) {
    if ((((in_RDI->super_Symbol).kind == Net) || ((in_RDI->super_Symbol).kind == ModportPort)) ||
       (((in_RDI->super_Symbol).kind == Variable && (in_ECX != 0)))) {
      if ((in_RDI->super_Symbol).kind == ModportPort) {
        pMVar3 = Symbol::as<slang::ast::ModportPortSymbol>((Symbol *)0x4ff970);
        AVar1 = pMVar3->direction;
        if ((AVar1 == InOut) ||
           (((in_ECX != 0 || (AVar1 == In)) && ((in_ECX != 1 || (AVar1 == Out)))))) {
          local_1 = true;
        }
        else {
          checkPathTerminal::anon_class_32_4_2c8b6779::operator()
                    ((anon_class_32_4_2c8b6779 *)in_RDX);
          local_1 = false;
        }
      }
      else {
        this_01 = in_RDX;
        this = Symbol::getParentScope(&in_RDI->super_Symbol);
        pSVar4 = Scope::asSymbol(this);
        if (pSVar4->kind == InstanceBody) {
          this_00 = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x4ff9fe);
          pDVar5 = InstanceBodySymbol::getDefinition(this_00);
          if (pDVar5->definitionKind == Interface) {
            return true;
          }
        }
        pSVar6 = Scope::asSymbol(in_RDX);
        if (pSVar4 == pSVar6) {
          if (in_ECX == 2) {
            local_1 = true;
          }
          else {
            for (local_b0 = ValueSymbol::getFirstPortBackref(in_RDI); local_b0 != (PortBackref *)0x0
                ; local_b0 = ValueSymbol::PortBackref::getNextBackreference(local_b0)) {
              pPVar7 = not_null<const_slang::ast::PortSymbol_*>::operator->
                                 ((not_null<const_slang::ast::PortSymbol_*> *)0x4ffac4);
              AVar1 = pPVar7->direction;
              if (((AVar1 == InOut) || ((in_ECX == 0 && (AVar1 == In)))) ||
                 ((in_ECX == 1 && (AVar1 == Out)))) {
                return true;
              }
            }
            checkPathTerminal::anon_class_32_4_2c8b6779::operator()
                      ((anon_class_32_4_2c8b6779 *)this_01);
            local_1 = false;
          }
        }
        else {
          Scope::addDiag(in_stack_00000078,(DiagCode)dir,in_stack_00000080);
          local_1 = false;
        }
      }
    }
    else {
      checkPathTerminal::anon_class_32_4_2c8b6779::operator()((anon_class_32_4_2c8b6779 *)in_RDX);
      local_1 = false;
    }
  }
  else {
    bVar2 = Type::isError((Type *)0x4ff838);
    if (!bVar2) {
      Scope::addDiag(in_stack_00000078,(DiagCode)dir,in_stack_00000080);
      arg._M_str = (char *)in_stack_ffffffffffffff90;
      arg._M_len = (size_t)in_stack_ffffffffffffff88;
      Diagnostic::operator<<
                ((Diagnostic *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),arg);
      ast::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SpecifyBlockSymbol::checkPathTerminal(const ValueSymbol& terminal, const Type& type,
                                           const Scope& specifyParent, SpecifyTerminalDir dir,
                                           SourceRange sourceRange) {
    // Type must be integral.
    if (!type.isIntegral()) {
        if (!type.isError())
            specifyParent.addDiag(diag::InvalidSpecifyType, sourceRange) << terminal.name << type;
        return false;
    }

    auto reportErr = [&] {
        auto code = dir == SpecifyTerminalDir::Input ? diag::InvalidSpecifySource
                                                     : diag::InvalidSpecifyDest;
        auto& diag = specifyParent.addDiag(code, sourceRange) << terminal.name;
        diag.addNote(diag::NoteDeclarationHere, terminal.location);
    };

    // Inputs must be nets (or modport ports) and outputs must
    // be nets or variables (or modport ports).
    if (terminal.kind != SymbolKind::Net && terminal.kind != SymbolKind::ModportPort &&
        (terminal.kind != SymbolKind::Variable || dir == SpecifyTerminalDir::Input)) {
        reportErr();
        return false;
    }

    if (terminal.kind == SymbolKind::ModportPort) {
        // Check that the modport port has the correct direction.
        auto portDir = terminal.as<ModportPortSymbol>().direction;
        if (portDir != ArgumentDirection::InOut &&
            ((dir == SpecifyTerminalDir::Input && portDir != ArgumentDirection::In) ||
             (dir == SpecifyTerminalDir::Output && portDir != ArgumentDirection::Out))) {
            reportErr();
            return false;
        }
        return true;
    }

    auto terminalParentScope = terminal.getParentScope();
    SLANG_ASSERT(terminalParentScope);

    auto& terminalParent = terminalParentScope->asSymbol();
    if (terminalParent.kind == SymbolKind::InstanceBody &&
        terminalParent.as<InstanceBodySymbol>().getDefinition().definitionKind ==
            DefinitionKind::Interface) {
        // If the signal is part of an interface then the only way we could have accessed
        // it is through an interface port, in which case the direction is "inout" and
        // therefore fine no matter whether this is an input or output terminal.
        return true;
    }

    // If we get here then the terminal must be a member of the module containing
    // our parent specify block.
    if (&terminalParent != &specifyParent.asSymbol()) {
        specifyParent.addDiag(diag::InvalidSpecifyPath, sourceRange);
        return false;
    }

    if (dir == SpecifyTerminalDir::Both)
        return true;

    // Check that the terminal is connected to a module port and that
    // the direction is correct.
    for (auto portRef = terminal.getFirstPortBackref(); portRef;
         portRef = portRef->getNextBackreference()) {
        auto portDir = portRef->port->direction;
        if (portDir == ArgumentDirection::InOut ||
            (dir == SpecifyTerminalDir::Input && portDir == ArgumentDirection::In) ||
            (dir == SpecifyTerminalDir::Output && portDir == ArgumentDirection::Out)) {
            return true;
        }
    }

    reportErr();
    return false;
}